

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O3

bool __thiscall
so_5::env_infrastructures::st_reusable_stuff::coop_repo_t::has_live_coop(coop_repo_t *this)

{
  mutex *__mutex;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  
  __mutex = &(this->super_coop_repository_basis_t).m_coop_operations_lock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    sVar1 = (this->super_coop_repository_basis_t).m_deregistered_coop._M_t._M_impl.
            super__Rb_tree_header._M_node_count;
    sVar2 = (this->super_coop_repository_basis_t).m_registered_coop._M_t._M_impl.
            super__Rb_tree_header._M_node_count;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return sVar1 != 0 || sVar2 != 0;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool
		has_live_coop()
			{
				// A lock is necessary here because coop_repo can be used
				// in thread-safe environment where access to environment from
				// different thread is allowed.
				std::lock_guard< std::mutex > l{ lock() };
				return !( m_registered_coop.empty() && m_deregistered_coop.empty() );
			}